

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMakeUtil.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::Buffer::Buffer
          (Buffer *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkBufferCreateInfo *bufferCreateInfo,MemoryRequirement memoryRequirement)

{
  undefined1 local_78 [16];
  VkDevice local_68;
  VkAllocationCallbacks *pVStack_60;
  Move<vk::Handle<(vk::HandleType)8>_> local_50;
  
  ::vk::createBuffer(&local_50,vk,device,bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_68 = local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_60 = local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_78._0_8_ = local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_78._8_8_ =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_78,vk,device,
             allocator,
             (VkBuffer)
             (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
             ,memoryRequirement);
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)local_78._0_8_;
  return;
}

Assistant:

Buffer::Buffer (const vk::DeviceInterface&		vk,
				const vk::VkDevice				device,
				vk::Allocator&					allocator,
				const vk::VkBufferCreateInfo&	bufferCreateInfo,
				const vk::MemoryRequirement		memoryRequirement)
	: m_buffer		(createBuffer(vk, device, &bufferCreateInfo))
	, m_allocation	(bindBuffer(vk, device, allocator, *m_buffer, memoryRequirement))
{
}